

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O0

int mk_utils_hex2int(char *hex,int len)

{
  char cVar1;
  int iVar2;
  int local_24;
  int iStack_20;
  char c;
  int res;
  int i;
  int len_local;
  char *hex_local;
  
  iStack_20 = 0;
  local_24 = 0;
  _i = hex;
  do {
    cVar1 = *_i;
    if (cVar1 == '\0' || len <= iStack_20) {
      if (local_24 < 0) {
        hex_local._4_4_ = -1;
      }
      else {
        hex_local._4_4_ = local_24;
      }
      return hex_local._4_4_;
    }
    if ((cVar1 < 'a') || ('f' < cVar1)) {
      if ((cVar1 < 'A') || ('F' < cVar1)) {
        if ((cVar1 < '0') || ('9' < cVar1)) {
          return -1;
        }
        iVar2 = cVar1 + -0x30;
      }
      else {
        iVar2 = cVar1 + -0x37;
      }
    }
    else {
      iVar2 = cVar1 + -0x57;
    }
    local_24 = iVar2 + local_24 * 0x10;
    iStack_20 = iStack_20 + 1;
    _i = _i + 1;
  } while( true );
}

Assistant:

int mk_utils_hex2int(char *hex, int len)
{
    int i = 0;
    int res = 0;
    char c;

    while ((c = *hex++) && i < len) {
        res *= 0x10;

        if (c >= 'a' && c <= 'f') {
            res += (c - 0x57);
        }
        else if (c >= 'A' && c <= 'F') {
            res += (c - 0x37);
        }
        else if (c >= '0' && c <= '9') {
            res += (c - 0x30);
        }
        else {
            return -1;
        }
        i++;
    }

    if (res < 0) {
        return -1;
    }

    return res;
}